

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O0

void __thiscall
session::send_lambda::operator()
          (send_lambda *this,
          message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          *msg)

{
  session *psVar1;
  element_type *msg_00;
  element_type *this_00;
  bool *in_R8;
  undefined1 local_7d [13];
  enable_shared_from_this<session> local_70;
  code *local_60;
  undefined8 local_58;
  bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>
  local_50;
  undefined1 local_28 [8];
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  sp;
  message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  *msg_local;
  send_lambda *this_local;
  
  sp.
  super___shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)msg;
  std::
  make_shared<boost::beast::http::message<false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>>,boost::beast::http::message<false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>>>
            ((message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_28);
  std::shared_ptr<void>::operator=
            (&this->self_->res_,
             (shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
              *)local_28);
  psVar1 = this->self_;
  msg_00 = std::
           __shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_28);
  local_60 = on_write;
  local_58 = 0;
  std::enable_shared_from_this<session>::shared_from_this
            ((enable_shared_from_this<session> *)(local_7d + 0xd));
  this_00 = std::
            __shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  local_7d[0] = boost::beast::http::
                message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                ::need_eof(this_00);
  boost::beast::
  bind_front_handler<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>
            (&local_50,(beast *)&local_60,(offset_in_session_to_subr *)(local_7d + 0xd),
             (shared_ptr<session> *)local_7d,in_R8);
  boost::beast::http::
  async_write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>,boost::beast::detail::bind_front_wrapper<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>>
            (&psVar1->stream_,msg_00,&local_50,(type *)0x0);
  boost::beast::detail::
  bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>
  ::~bind_front_wrapper(&local_50);
  std::shared_ptr<session>::~shared_ptr((shared_ptr<session> *)(local_7d + 0xd));
  std::
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *)local_28);
  return;
}

Assistant:

void
        operator()(http::message<isRequest, Body, Fields>&& msg) const
        {
            // The lifetime of the message has to extend
            // for the duration of the async operation so
            // we use a shared_ptr to manage it.
            auto sp = std::make_shared<
                http::message<isRequest, Body, Fields>>(std::move(msg));

            // Store a type-erased version of the shared
            // pointer in the class to keep it alive.
            self_.res_ = sp;

            // Write the response
            http::async_write(
                self_.stream_,
                *sp,
                beast::bind_front_handler(
                    &session::on_write,
                    self_.shared_from_this(),
                    sp->need_eof()));
        }